

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

TestSuite * __thiscall testing::UnitTest::current_test_suite(UnitTest *this)

{
  TestSuite *pTVar1;
  
  internal::MutexBase::Lock(&(this->mutex_).super_MutexBase);
  pTVar1 = this->impl_->current_test_suite_;
  internal::MutexBase::Unlock(&(this->mutex_).super_MutexBase);
  return pTVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(mutex_) {
  internal::MutexLock lock(&mutex_);
  return impl_->current_test_suite();
}